

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildFileGenerator::SetImportLocationProperty
          (cmExportBuildFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  cmMakefile *this_00;
  pointer ppcVar1;
  bool bVar2;
  TargetType TVar3;
  string *__rhs;
  mapped_type *pmVar4;
  cmValue cVar5;
  pointer ppcVar6;
  string_view separator;
  string obj_dir;
  string prop;
  cmAlphaNum local_98;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  
  this_00 = target->Makefile;
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 == OBJECT_LIBRARY) {
    obj_dir._M_dataplus._M_p = &DAT_00000010;
    obj_dir._M_string_length = (size_type)anon_var_dwarf_694579;
    local_98.View_._M_str = (suffix->_M_dataplus)._M_p;
    local_98.View_._M_len = suffix->_M_string_length;
    cmStrCat<>(&prop,(cmAlphaNum *)&obj_dir,&local_98);
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetObjectSources(target,&objectSources,config);
    cmGeneratorTarget::GetObjectDirectory(&obj_dir,target,config);
    ppcVar1 = objectSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    objects.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    objects.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    objects.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (ppcVar6 = objectSources.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
        ppcVar6 = ppcVar6 + 1) {
      __rhs = cmGeneratorTarget::GetObjectName_abi_cxx11_(target,*ppcVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                     &obj_dir,__rhs);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&objects,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    separator._M_str = ";";
    separator._M_len = 1;
    cmJoin((string *)&local_98,&objects,separator,(string_view)ZEXT816(0));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&prop);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&objects);
    std::__cxx11::string::~string((string *)&obj_dir);
    std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
              (&objectSources.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  }
  else {
    obj_dir._M_dataplus._M_p = &DAT_00000011;
    obj_dir._M_string_length = (size_type)anon_var_dwarf_548d95;
    local_98.View_._M_str = (suffix->_M_dataplus)._M_p;
    local_98.View_._M_len = suffix->_M_string_length;
    cmStrCat<>(&prop,(cmAlphaNum *)&obj_dir,&local_98);
    obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
    obj_dir._M_string_length = 0;
    obj_dir.field_2._M_local_buf[0] = '\0';
    bVar2 = cmGeneratorTarget::IsAppBundleOnApple(target);
    if (bVar2) {
      cmGeneratorTarget::GetFullPath((string *)&local_98,target,config,RuntimeBinaryArtifact,false);
    }
    else {
      cmGeneratorTarget::GetFullPath((string *)&local_98,target,config,RuntimeBinaryArtifact,true);
    }
    std::__cxx11::string::operator=((string *)&obj_dir,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&prop);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&obj_dir);
    std::__cxx11::string::~string((string *)&prop);
    bVar2 = cmGeneratorTarget::HasImportLibrary(target,config);
    if (!bVar2) {
      return;
    }
    obj_dir._M_dataplus._M_p = (pointer)0xf;
    obj_dir._M_string_length = (size_type)anon_var_dwarf_694503;
    local_98.View_._M_str = (suffix->_M_dataplus)._M_p;
    local_98.View_._M_len = suffix->_M_string_length;
    cmStrCat<>(&prop,(cmAlphaNum *)&obj_dir,&local_98);
    cmGeneratorTarget::GetFullPath(&obj_dir,target,config,ImportLibraryArtifact,false);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator<char> *)&objectSources);
    cVar5 = cmMakefile::GetDefinition(this_00,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if (cVar5.Value != (string *)0x0) {
      cmGeneratorTarget::GetImplibGNUtoMS
                (target,config,&obj_dir,&obj_dir,"${CMAKE_IMPORT_LIBRARY_SUFFIX}");
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,&prop);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&obj_dir);
  }
  std::__cxx11::string::~string((string *)&prop);
  return;
}

Assistant:

void cmExportBuildFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::string prop = cmStrCat("IMPORTED_OBJECTS", suffix);

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<cmSourceFile const*> objectSources;
    target->GetObjectSources(objectSources, config);
    std::string const obj_dir = target->GetObjectDirectory(config);
    std::vector<std::string> objects;
    for (cmSourceFile const* sf : objectSources) {
      const std::string& obj = target->GetObjectName(sf);
      objects.push_back(obj_dir + obj);
    }

    // Store the property.
    properties[prop] = cmJoin(objects, ";");
  } else {
    // Add the main target file.
    {
      std::string prop = cmStrCat("IMPORTED_LOCATION", suffix);
      std::string value;
      if (target->IsAppBundleOnApple()) {
        value =
          target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
      } else {
        value = target->GetFullPath(config,
                                    cmStateEnums::RuntimeBinaryArtifact, true);
      }
      properties[prop] = value;
    }

    // Add the import library for windows DLLs.
    if (target->HasImportLibrary(config)) {
      std::string prop = cmStrCat("IMPORTED_IMPLIB", suffix);
      std::string value =
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact);
      if (mf->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
        target->GetImplibGNUtoMS(config, value, value,
                                 "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      }
      properties[prop] = value;
    }
  }
}